

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,string *name_suffix,offset_in_MessageGenerator_to_subr pfn)

{
  long *plVar1;
  ZeroCopyOutputStream *output;
  char **ppcVar2;
  size_type *psVar3;
  MessageGenerator generator;
  Printer printer;
  value_type local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Printer local_78;
  
  std::operator+(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (java_package->_M_dataplus)._M_p);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,
                              (ulong)(file_list->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
  ppcVar2 = (char **)(plVar1 + 2);
  if ((char **)*plVar1 == ppcVar2) {
    local_78.buffer_ = *ppcVar2;
    local_78._24_8_ = plVar1[3];
    local_78._0_8_ = &local_78.buffer_;
  }
  else {
    local_78.buffer_ = *ppcVar2;
    local_78._0_8_ = (char **)*plVar1;
  }
  local_78.output_ = (ZeroCopyOutputStream *)plVar1[1];
  *plVar1 = (long)ppcVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append(&local_78.variable_delimiter_);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_b8.field_2._M_allocated_capacity = *psVar3;
    local_b8.field_2._8_8_ = plVar1[3];
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar3;
    local_b8._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_b8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((char **)local_78._0_8_ != &local_78.buffer_) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_78.buffer_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,&local_b8);
  output = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,&local_b8);
  io::Printer::Printer(&local_78,output,'$');
  io::Printer::Print(&local_78,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",(string *)**(undefined8 **)&java_package->field_2);
  if (package_dir->_M_string_length != 0) {
    io::Printer::Print(&local_78,"package $package$;\n\n","package",package_dir);
  }
  MessageGenerator::MessageGenerator((MessageGenerator *)&local_98,(Descriptor *)java_package);
  plVar1 = (long *)((long)&local_98._M_dataplus._M_p + pfn);
  if (((ulong)name_suffix & 1) != 0) {
    name_suffix = *(string **)(*plVar1 + -1 + (long)name_suffix);
  }
  (*(code *)name_suffix)(plVar1,&local_78);
  MessageGenerator::~MessageGenerator((MessageGenerator *)&local_98);
  io::Printer::~Printer(&local_78);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void GenerateSibling(const string& package_dir,
                            const string& java_package,
                            const DescriptorClass* descriptor,
                            GeneratorContext* context,
                            vector<string>* file_list,
                            const string& name_suffix,
                            void (GeneratorClass::*pfn)(io::Printer* printer)) {
  string filename = package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);

  scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$');

  printer.Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
      "package $package$;\n"
      "\n",
      "package", java_package);
  }

  GeneratorClass generator(descriptor);
  (generator.*pfn)(&printer);
}